

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_ntlm_core.c
# Opt level: O0

CURLcode Curl_ntlm_core_mk_ntlmv2_hash
                   (char *user,size_t userlen,char *domain,size_t domlen,uchar *ntlmhash,
                   uchar *ntlmv2hash)

{
  size_t datalen;
  uchar *dest;
  CURLcode result;
  uchar *identity;
  size_t identity_len;
  uchar *ntlmv2hash_local;
  uchar *ntlmhash_local;
  size_t domlen_local;
  char *domain_local;
  size_t userlen_local;
  char *user_local;
  
  if ((userlen < 0x7a1201) && (domlen < 0x7a1201)) {
    datalen = (userlen + domlen) * 2;
    dest = (uchar *)(*Curl_cmalloc)(datalen + 1);
    if (dest == (uchar *)0x0) {
      user_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      ascii_uppercase_to_unicode_le(dest,user,userlen);
      ascii_to_unicode_le(dest + userlen * 2,domain,domlen);
      user_local._4_4_ = Curl_hmacit(Curl_HMAC_MD5,ntlmhash,0x10,dest,datalen,ntlmv2hash);
      (*Curl_cfree)(dest);
    }
  }
  else {
    user_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  return user_local._4_4_;
}

Assistant:

CURLcode Curl_ntlm_core_mk_ntlmv2_hash(const char *user, size_t userlen,
                                       const char *domain, size_t domlen,
                                       unsigned char *ntlmhash,
                                       unsigned char *ntlmv2hash)
{
  /* Unicode representation */
  size_t identity_len;
  unsigned char *identity;
  CURLcode result = CURLE_OK;

  if((userlen > CURL_MAX_INPUT_LENGTH) || (domlen > CURL_MAX_INPUT_LENGTH))
    return CURLE_OUT_OF_MEMORY;

  identity_len = (userlen + domlen) * 2;
  identity = malloc(identity_len + 1);

  if(!identity)
    return CURLE_OUT_OF_MEMORY;

  ascii_uppercase_to_unicode_le(identity, user, userlen);
  ascii_to_unicode_le(identity + (userlen << 1), domain, domlen);

  result = Curl_hmacit(Curl_HMAC_MD5, ntlmhash, 16, identity, identity_len,
                       ntlmv2hash);
  free(identity);

  return result;
}